

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tiny_obj_loader.h
# Opt level: O0

void tinyobj::InitMaterial(material_t *material)

{
  string *in_RDI;
  int i;
  int local_c;
  
  InitTexOpt((texture_option_t *)(in_RDI + 0x170),false);
  InitTexOpt((texture_option_t *)(in_RDI + 0x1d0),false);
  InitTexOpt((texture_option_t *)(in_RDI + 0x230),false);
  InitTexOpt((texture_option_t *)(in_RDI + 0x290),false);
  InitTexOpt((texture_option_t *)(in_RDI + 0x2f0),true);
  InitTexOpt((texture_option_t *)(in_RDI + 0x350),false);
  InitTexOpt((texture_option_t *)(in_RDI + 0x3b0),false);
  InitTexOpt((texture_option_t *)(in_RDI + 0x410),false);
  InitTexOpt((texture_option_t *)(in_RDI + 0x530),false);
  InitTexOpt((texture_option_t *)(in_RDI + 0x590),false);
  InitTexOpt((texture_option_t *)(in_RDI + 0x5f0),false);
  InitTexOpt((texture_option_t *)(in_RDI + 0x650),false);
  InitTexOpt((texture_option_t *)(in_RDI + 0x6b0),false);
  std::__cxx11::string::operator=(in_RDI,"");
  std::__cxx11::string::operator=(in_RDI + 0x70,"");
  std::__cxx11::string::operator=(in_RDI + 0x90,"");
  std::__cxx11::string::operator=(in_RDI + 0xb0,"");
  std::__cxx11::string::operator=(in_RDI + 0xd0,"");
  std::__cxx11::string::operator=(in_RDI + 0xf0,"");
  std::__cxx11::string::operator=(in_RDI + 0x110,"");
  std::__cxx11::string::operator=(in_RDI + 0x150,"");
  std::__cxx11::string::operator=(in_RDI + 0x130,"");
  for (local_c = 0; local_c < 3; local_c = local_c + 1) {
    *(undefined4 *)(in_RDI + (long)local_c * 4 + 0x20) = 0;
    *(undefined4 *)(in_RDI + (long)local_c * 4 + 0x2c) = 0;
    *(undefined4 *)(in_RDI + (long)local_c * 4 + 0x38) = 0;
    *(undefined4 *)(in_RDI + (long)local_c * 4 + 0x44) = 0;
    *(undefined4 *)(in_RDI + (long)local_c * 4 + 0x50) = 0;
  }
  *(undefined4 *)(in_RDI + 0x68) = 0;
  *(undefined4 *)(in_RDI + 100) = 0x3f800000;
  *(undefined4 *)(in_RDI + 0x5c) = 0x3f800000;
  *(undefined4 *)(in_RDI + 0x60) = 0x3f800000;
  *(undefined4 *)(in_RDI + 0x470) = 0;
  *(undefined4 *)(in_RDI + 0x474) = 0;
  *(undefined4 *)(in_RDI + 0x478) = 0;
  *(undefined4 *)(in_RDI + 0x47c) = 0;
  *(undefined4 *)(in_RDI + 0x480) = 0;
  *(undefined4 *)(in_RDI + 0x488) = 0;
  *(undefined4 *)(in_RDI + 0x484) = 0;
  std::__cxx11::string::operator=(in_RDI + 0x490,"");
  std::__cxx11::string::operator=(in_RDI + 0x4b0,"");
  std::__cxx11::string::operator=(in_RDI + 0x4d0,"");
  std::__cxx11::string::operator=(in_RDI + 0x4f0,"");
  std::__cxx11::string::operator=(in_RDI + 0x510,"");
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::clear((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           *)0x1a99d7);
  return;
}

Assistant:

static void InitMaterial(material_t *material) {
  InitTexOpt(&material->ambient_texopt, /* is_bump */ false);
  InitTexOpt(&material->diffuse_texopt, /* is_bump */ false);
  InitTexOpt(&material->specular_texopt, /* is_bump */ false);
  InitTexOpt(&material->specular_highlight_texopt, /* is_bump */ false);
  InitTexOpt(&material->bump_texopt, /* is_bump */ true);
  InitTexOpt(&material->displacement_texopt, /* is_bump */ false);
  InitTexOpt(&material->alpha_texopt, /* is_bump */ false);
  InitTexOpt(&material->reflection_texopt, /* is_bump */ false);
  InitTexOpt(&material->roughness_texopt, /* is_bump */ false);
  InitTexOpt(&material->metallic_texopt, /* is_bump */ false);
  InitTexOpt(&material->sheen_texopt, /* is_bump */ false);
  InitTexOpt(&material->emissive_texopt, /* is_bump */ false);
  InitTexOpt(&material->normal_texopt,
             /* is_bump */ false);  // @fixme { is_bump will be true? }
  material->name = "";
  material->ambient_texname = "";
  material->diffuse_texname = "";
  material->specular_texname = "";
  material->specular_highlight_texname = "";
  material->bump_texname = "";
  material->displacement_texname = "";
  material->reflection_texname = "";
  material->alpha_texname = "";
  for (int i = 0; i < 3; i++) {
    material->ambient[i] = static_cast<real_t>(0.0);
    material->diffuse[i] = static_cast<real_t>(0.0);
    material->specular[i] = static_cast<real_t>(0.0);
    material->transmittance[i] = static_cast<real_t>(0.0);
    material->emission[i] = static_cast<real_t>(0.0);
  }
  material->illum = 0;
  material->dissolve = static_cast<real_t>(1.0);
  material->shininess = static_cast<real_t>(1.0);
  material->ior = static_cast<real_t>(1.0);

  material->roughness = static_cast<real_t>(0.0);
  material->metallic = static_cast<real_t>(0.0);
  material->sheen = static_cast<real_t>(0.0);
  material->clearcoat_thickness = static_cast<real_t>(0.0);
  material->clearcoat_roughness = static_cast<real_t>(0.0);
  material->anisotropy_rotation = static_cast<real_t>(0.0);
  material->anisotropy = static_cast<real_t>(0.0);
  material->roughness_texname = "";
  material->metallic_texname = "";
  material->sheen_texname = "";
  material->emissive_texname = "";
  material->normal_texname = "";

  material->unknown_parameter.clear();
}